

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchronous_factory.h
# Opt level: O0

shared_ptr<spdlog::logger>
spdlog::synchronous_factory::
create<spdlog::sinks::rotating_file_sink<std::mutex>,std::__cxx11::string_const&,unsigned_long&,unsigned_long&,bool&>
          (string *logger_name,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          unsigned_long *args_1,unsigned_long *args_2,bool *args_3)

{
  registry *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<spdlog::logger> sVar1;
  shared_ptr<spdlog::logger> *in_stack_00000018;
  registry *in_stack_00000020;
  shared_ptr<spdlog::sinks::rotating_file_sink<std::mutex>_> sink;
  shared_ptr<spdlog::logger> *new_logger;
  shared_ptr<spdlog::sinks::rotating_file_sink<std::mutex>_> *__args_1;
  element_type *in_stack_ffffffffffffff98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  shared_ptr<spdlog::sinks::rotating_file_sink<std::mutex>_> local_40 [4];
  
  __args_1 = local_40;
  std::
  make_shared<spdlog::sinks::rotating_file_sink<std::mutex>,std::__cxx11::string_const&,unsigned_long&,unsigned_long&,bool&>
            (in_stack_ffffffffffffffa8,(unsigned_long *)in_stack_ffffffffffffffa0._M_pi,
             (unsigned_long *)in_stack_ffffffffffffff98,(bool *)__args_1);
  std::
  make_shared<spdlog::logger,std::__cxx11::string,std::shared_ptr<spdlog::sinks::rotating_file_sink<std::mutex>>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff98,__args_1);
  this = details::registry::instance();
  std::shared_ptr<spdlog::logger>::shared_ptr
            ((shared_ptr<spdlog::logger> *)this,
             (shared_ptr<spdlog::logger> *)&stack0xffffffffffffff98);
  details::registry::initialize_logger(in_stack_00000020,in_stack_00000018);
  std::shared_ptr<spdlog::logger>::~shared_ptr((shared_ptr<spdlog::logger> *)0x142a3a);
  std::shared_ptr<spdlog::sinks::rotating_file_sink<std::mutex>_>::~shared_ptr
            ((shared_ptr<spdlog::sinks::rotating_file_sink<std::mutex>_> *)0x142a96);
  sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<spdlog::logger>)
         sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<spdlog::logger> create(std::string logger_name, SinkArgs &&...args)
    {
        auto sink = std::make_shared<Sink>(std::forward<SinkArgs>(args)...);
        auto new_logger = std::make_shared<spdlog::logger>(std::move(logger_name), std::move(sink));
        details::registry::instance().initialize_logger(new_logger);
        return new_logger;
    }